

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_last_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  basic_string_view<char,_std::char_traits<char>_> v_00;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_iterator pcVar4;
  _func_bool_char_ptr_char_ptr *__comp;
  size_type local_88;
  size_type local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  reverse_iterator<const_char_*> local_58;
  reverse_iterator<const_char_*> local_50;
  reverse_iterator<const_char_*> local_48;
  reverse_iterator<const_char_*> local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  const_pointer local_30;
  ulong local_28;
  size_type pos_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  basic_string_view<char,_std::char_traits<char>_> v_local;
  
  v_local.data_ = (const_pointer)v.size_;
  this_local = (basic_string_view<char,_std::char_traits<char>_> *)v.data_;
  local_28 = pos;
  pos_local = (size_type)this;
  bVar2 = empty(this);
  uVar1 = local_28;
  if (bVar2) {
    local_78 = 0xffffffffffffffff;
  }
  else {
    sVar3 = size(this);
    if (uVar1 < sVar3) {
      pcVar4 = cbegin(this);
      std::reverse_iterator<const_char_*>::reverse_iterator(&local_58,pcVar4 + local_28 + 1);
      std::reverse_iterator<const_char_*>::reverse_iterator(&local_50,&local_58);
      crend(&local_68);
      std::reverse_iterator<const_char_*>::reverse_iterator
                ((reverse_iterator<const_char_*> *)&local_68.size_,
                 (reverse_iterator<const_char_*> *)&local_68);
      pcVar4 = cbegin((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      __comp = (_func_bool_char_ptr_char_ptr *)
               cend((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      std::
      find_first_of<std::reverse_iterator<char_const*>,char_const*,bool(*)(char_const&,char_const&)>
                (&local_48,&local_50,(char *)&local_68.size_,pcVar4,__comp);
      std::reverse_iterator<const_char_*>::reverse_iterator(&local_40,&local_48);
      local_88 = to_pos(this,&local_40);
    }
    else {
      local_38 = this_local;
      local_30 = v_local.data_;
      sVar3 = size(this);
      v_00.size_ = (size_type)local_30;
      v_00.data_ = (const_pointer)local_38;
      local_88 = find_last_of(this,v_00,sVar3 - 1);
    }
    local_78 = local_88;
  }
  return local_78;
}

Assistant:

nssv_constexpr size_type find_last_of( basic_string_view v, size_type pos = npos ) const nssv_noexcept  // (1)
    {
        return empty()
            ? npos
            : pos >= size()
            ? find_last_of( v, size() - 1 )
            : to_pos( std::find_first_of( const_reverse_iterator( cbegin() + pos + 1 ), crend(), v.cbegin(), v.cend(), Traits::eq ) );
    }